

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stripctrl.c
# Opt level: O3

StripCtrlChars * stripctrl_new(BinarySink *bs_out,_Bool permit_cr,wchar_t substitution)

{
  void *__s;
  
  __s = safemalloc(1,0xb0,0);
  memset(__s,0,0x90);
  *(BinarySink **)((long)__s + 0x90) = bs_out;
  *(_Bool *)((long)__s + 0x10) = permit_cr;
  *(wchar_t *)((long)__s + 0x14) = substitution;
  *(code **)((long)__s + 0x98) = stripctrl_locale_BinarySink_write;
  *(undefined8 *)((long)__s + 0xa0) = 0;
  *(StripCtrlChars **)((long)__s + 0xa8) = (StripCtrlChars *)((long)__s + 0x98);
  return (StripCtrlChars *)((long)__s + 0x98);
}

Assistant:

StripCtrlChars *stripctrl_new(
    BinarySink *bs_out, bool permit_cr, wchar_t substitution)
{
    StripCtrlCharsImpl *scc = stripctrl_new_common(
        bs_out, permit_cr, substitution);
    BinarySink_INIT(&scc->public, stripctrl_locale_BinarySink_write);
    return &scc->public;
}